

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_iso_time(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
              *this)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  on_24_hour_time(this);
  pbVar1 = (this->out).container;
  if ((pbVar1->super_basic_buffer<char>).capacity_ < (pbVar1->super_basic_buffer<char>).size_ + 1) {
    (**(pbVar1->super_basic_buffer<char>)._vptr_basic_buffer)(pbVar1);
  }
  sVar2 = (pbVar1->super_basic_buffer<char>).size_;
  (pbVar1->super_basic_buffer<char>).size_ = sVar2 + 1;
  (pbVar1->super_basic_buffer<char>).ptr_[sVar2] = ':';
  lVar3 = (this->s).__r;
  auVar4 = SEXT816(lVar3) * ZEXT816(0x8888888888888889);
  write(this,(int)lVar3 + ((int)(auVar4._8_8_ >> 5) - (auVar4._12_4_ >> 0x1f)) * -0x3c,(void *)0x2,
        0x8888888888888889);
  return;
}

Assistant:

void on_iso_time() {
    on_24_hour_time();
    *out++ = ':';
    write(second(), 2);
  }